

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageBrushApply(gdImagePtr im,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int color;
  uint uVar5;
  int p_2;
  int tc;
  int p_1;
  int p;
  int srcy;
  int srcx;
  int y2;
  int x2;
  int y1;
  int x1;
  int hx;
  int hy;
  int ly;
  int lx;
  int y_local;
  int x_local;
  gdImagePtr im_local;
  
  if (im->brush != (gdImageStruct *)0x0) {
    hx = y - im->brush->sy / 2;
    iVar1 = hx + im->brush->sy;
    iVar2 = x - im->brush->sx / 2;
    iVar3 = iVar2 + im->brush->sx;
    p_1 = 0;
    if (im->trueColor == 0) {
      for (; hx < iVar1; hx = hx + 1) {
        p = 0;
        for (hy = iVar2; hy < iVar3; hy = hy + 1) {
          uVar5 = gdImageGetPixel(im->brush,p,p_1);
          if (uVar5 != im->brush->transparent) {
            if (im->brush->trueColor == 0) {
              gdImageSetPixel(im,hy,hx,im->brushColorMap[(int)uVar5]);
            }
            else {
              iVar4 = gdImageColorResolveAlpha
                                (im,(int)(uVar5 & 0xff0000) >> 0x10,(int)(uVar5 & 0xff00) >> 8,
                                 uVar5 & 0xff,(int)(uVar5 & 0x7f000000) >> 0x18);
              gdImageSetPixel(im,hy,hx,iVar4);
            }
          }
          p = p + 1;
        }
        p_1 = p_1 + 1;
      }
    }
    else if (im->brush->trueColor == 0) {
      for (; hx < iVar1; hx = hx + 1) {
        p = 0;
        for (hy = iVar2; hy < iVar3; hy = hy + 1) {
          iVar4 = gdImageGetPixel(im->brush,p,p_1);
          color = gdImageGetTrueColorPixel(im->brush,p,p_1);
          if (iVar4 != im->brush->transparent) {
            gdImageSetPixel(im,hy,hx,color);
          }
          p = p + 1;
        }
        p_1 = p_1 + 1;
      }
    }
    else {
      for (; hx < iVar1; hx = hx + 1) {
        p = 0;
        for (hy = iVar2; hy < iVar3; hy = hy + 1) {
          iVar4 = gdImageGetTrueColorPixel(im->brush,p,p_1);
          if (iVar4 != im->brush->transparent) {
            gdImageSetPixel(im,hy,hx,iVar4);
          }
          p = p + 1;
        }
        p_1 = p_1 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
gdImageBrushApply (gdImagePtr im, int x, int y)
{
	int lx, ly;
	int hy;
	int hx;
	int x1, y1, x2, y2;
	int srcx, srcy;
	if (!im->brush) {
		return;
	}
	hy = gdImageSY (im->brush) / 2;
	y1 = y - hy;
	y2 = y1 + gdImageSY (im->brush);
	hx = gdImageSX (im->brush) / 2;
	x1 = x - hx;
	x2 = x1 + gdImageSX (im->brush);
	srcy = 0;
	if (im->trueColor) {
		if (im->brush->trueColor) {
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p;
					p = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, p);
					}
					srcx++;
				}
				srcy++;
			}
		} else {
			/* 2.0.12: Brush palette, image truecolor (thanks to Thorben Kundinger
			   for pointing out the issue) */
			for (ly = y1; (ly < y2); ly++) {
				srcx = 0;
				for (lx = x1; (lx < x2); lx++) {
					int p, tc;
					p = gdImageGetPixel (im->brush, srcx, srcy);
					tc = gdImageGetTrueColorPixel (im->brush, srcx, srcy);
					/* 2.0.9, Thomas Winzig: apply simple full transparency */
					if (p != gdImageGetTransparent (im->brush)) {
						gdImageSetPixel (im, lx, ly, tc);
					}
					srcx++;
				}
				srcy++;
			}
		}
	} else {
		for (ly = y1; (ly < y2); ly++) {
			srcx = 0;
			for (lx = x1; (lx < x2); lx++) {
				int p;
				p = gdImageGetPixel (im->brush, srcx, srcy);
				/* Allow for non-square brushes! */
				if (p != gdImageGetTransparent (im->brush)) {
					/* Truecolor brush. Very slow
					   on a palette destination. */
					if (im->brush->trueColor) {
						gdImageSetPixel (im, lx, ly,
						                 gdImageColorResolveAlpha (im,
						                         gdTrueColorGetRed
						                         (p),
						                         gdTrueColorGetGreen
						                         (p),
						                         gdTrueColorGetBlue
						                         (p),
						                         gdTrueColorGetAlpha
						                         (p)));
					} else {
						gdImageSetPixel (im, lx, ly, im->brushColorMap[p]);
					}
				}
				srcx++;
			}
			srcy++;
		}
	}
}